

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifneuron.cxx
# Opt level: O3

string * __thiscall
IfNeuron::getParameter(string *__return_storage_ptr__,IfNeuron *this,string *name)

{
  int iVar1;
  long lVar2;
  stringstream param;
  string local_1e0;
  string local_1c0;
  stringstream local_1a0 [16];
  undefined1 local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  iVar1 = std::__cxx11::string::compare((char *)name);
  if (iVar1 == 0) {
    lVar2 = 0x300;
LAB_001348e9:
    std::ostream::_M_insert<double>
              (*(double *)((long)&(this->super_SpikingNeuron).super_Neuron._vptr_Neuron + lVar2));
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)name);
    if (iVar1 == 0) {
      lVar2 = 0x2f8;
      goto LAB_001348e9;
    }
    iVar1 = std::__cxx11::string::compare((char *)name);
    if (iVar1 == 0) {
      local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"starting-value","");
      DifferentialEquation::getParameter(&local_1e0,&this->ifneuronMembrane,&local_1c0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_190,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
LAB_001349e0:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      }
      local_1e0.field_2._M_allocated_capacity = local_1c0.field_2._M_allocated_capacity;
      local_1e0._M_dataplus._M_p = local_1c0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
LAB_00134a0a:
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)name);
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::string::compare((char *)name);
        if (iVar1 != 0) {
          Parametric::getParameter
                    (__return_storage_ptr__,
                     (Parametric *)&(this->super_SpikingNeuron).super_StochasticEventGenerator,name)
          ;
          goto LAB_00134a1f;
        }
        local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"mode","");
        DifferentialEquation::getParameter(&local_1e0,&this->ifneuronMembrane,&local_1c0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_190,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
        goto LAB_001349e0;
      }
      Parametric::getConfiguration_abi_cxx11_(&local_1e0,(Parametric *)&this->ifneuronMembrane);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_190,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) goto LAB_00134a0a;
    }
  }
  std::__cxx11::stringbuf::str();
LAB_00134a1f:
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

string IfNeuron::getParameter(const string& name) const
{
	stringstream param;
	if (name == "threshold")
		param << ifneuronTheta;
	else if (name=="spike-height")
		param << ifneuronSpikeHeight;
	else if (name== "membrane starting-value")
		param << ifneuronMembrane.getParameter("starting-value");
	else if (name=="membrane")
		param << ifneuronMembrane.getConfiguration();
	else if (name=="membrane integration-mode")
		param << ifneuronMembrane.getParameter("mode");
	else
		return SpikingNeuron::getParameter(name);
		
	return param.str();
}